

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

int stb__stb_idict_addset(stb_idict *a,stb_int32 k,stb_int32 v,int allow_new,int allow_old,int copy)

{
  stb__stb_idict__hashpair *psVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  if (k == 3) {
    bVar8 = a->has_del == '\0';
    if (bVar8) {
      if (allow_new != 0) goto LAB_00150c40;
    }
    else if (allow_old != 0) {
LAB_00150c40:
      a->dv = v;
      a->has_del = '\x01';
      goto LAB_00150c96;
    }
  }
  else if (k == 1) {
    bVar8 = a->has_empty == '\0';
    if (bVar8) {
      if (allow_new != 0) goto LAB_00150c33;
    }
    else if (allow_old != 0) {
LAB_00150c33:
      a->ev = v;
      a->has_empty = '\x01';
      goto LAB_00150c96;
    }
  }
  else {
    iVar4 = ((uint)k >> 0x13) + ((uint)k >> 6) + k;
    uVar5 = iVar4 * 0x80008 ^ iVar4 * 0x10001;
    uVar5 = (uVar5 >> 5) + uVar5;
    uVar5 = uVar5 * 4 ^ uVar5;
    uVar5 = (uVar5 >> 0xf) + uVar5;
    uVar5 = uVar5 * 0x400 ^ uVar5;
    uVar7 = (uVar5 >> 0x13) + (uVar5 >> 6) + uVar5;
    uVar5 = a->mask & uVar7;
    uVar6 = (ulong)uVar5;
    psVar1 = a->table;
    iVar4 = psVar1[uVar5].k;
    if (iVar4 != 1) {
      uVar3 = (ulong)uVar5;
      if ((iVar4 == 3) || (uVar3 = 0xffffffff, iVar4 != k)) {
        do {
          while( true ) {
            uVar5 = (int)uVar6 + ((uVar7 >> 0x13) + (uVar7 >> 6) + uVar7 | 1) & a->mask;
            uVar6 = (ulong)uVar5;
            iVar4 = psVar1[uVar6].k;
            uVar2 = (uint)uVar3;
            if (iVar4 == 1) {
              if (allow_new == 0) goto LAB_00150c83;
              if (-1 < (int)uVar2) {
                a->deleted = a->deleted + -1;
                uVar5 = uVar2;
              }
              goto LAB_00150c5d;
            }
            if (iVar4 != 3) break;
            if ((int)uVar2 < 0) {
              uVar3 = uVar6;
            }
          }
        } while (iVar4 != k);
        if (allow_old != 0) {
          psVar1[uVar6].v = v;
        }
      }
      else if (allow_old != 0) {
        psVar1[uVar5].v = v;
      }
      bVar8 = allow_new == 0;
      goto LAB_00150c96;
    }
    if (allow_new != 0) {
LAB_00150c5d:
      psVar1[(int)uVar5].k = k;
      psVar1[(int)uVar5].v = v;
      iVar4 = a->count;
      a->count = iVar4 + 1;
      bVar8 = true;
      if (a->grow_threshhold <= iVar4) {
        stb__stb_idict_rehash(a,a->limit * 2);
      }
      goto LAB_00150c96;
    }
  }
LAB_00150c83:
  bVar8 = false;
LAB_00150c96:
  return (int)bVar8;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}